

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateOptionalOutputs(Result *__return_storage_ptr__,ModelDescription *interface)

{
  bool bVar1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  FeatureType *this_00;
  allocator local_59;
  string local_58;
  FeatureDescription *output;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  ModelDescription *interface_local;
  
  this = Specification::ModelDescription::output(interface);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (this);
  output = (FeatureDescription *)
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(this);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end1,(iterator *)&output);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_58._M_storage._M_storage =
         (uchar  [8])
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*(&__end1);
    this_00 = Specification::FeatureDescription::type
                        ((FeatureDescription *)local_58._M_storage._M_storage);
    bVar1 = Specification::FeatureType::isoptional(this_00);
    if (bVar1) break;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Outputs cannot be optional.",&local_59);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOptionalOutputs(const Specification::ModelDescription& interface) {
        for (const auto& output : interface.output()) {
            if (output.type().isoptional()) {
                return Result(ResultType::INVALID_MODEL_INTERFACE, "Outputs cannot be optional.");
            }
        }
        return Result();
    }